

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void goodform::json::stringify_object(any *v,ostream *output)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *pmVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  ostream *output_local;
  any *v_local;
  
  it._M_node = (_Base_ptr)output;
  std::operator<<(output,"{");
  pmVar2 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                     (v);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::begin(pmVar2);
  while( true ) {
    pmVar2 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                       (v);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         ::end(pmVar2);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pmVar2 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                       (v);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         ::begin(pmVar2);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (bVar1) {
      std::operator<<((ostream *)it._M_node,",");
    }
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
             ::operator->(&local_20);
    write_string(&ppVar3->first,(ostream *)it._M_node);
    std::operator<<((ostream *)it._M_node,":");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
             ::operator->(&local_20);
    serialize(&ppVar3->second,(ostream *)it._M_node);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
    ::operator++(&local_20);
  }
  std::operator<<((ostream *)it._M_node,"}");
  return;
}

Assistant:

void json::stringify_object(const any& v, std::ostream& output)
  {
    output << "{";
    for (auto it = get<goodform::object_t>(v).begin(); it != get<goodform::object_t>(v).end(); ++it)
    {
      if (it != get<goodform::object_t>(v).begin())
        output << ",";
      write_string(it->first, output);
      output << ":";
      serialize(it->second, output);
    }
    output << "}";
  }